

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::RejectIncomingTxs(PeerManagerImpl *this,CNode *peer)

{
  bool bVar1;
  long in_FS_OFFSET;
  
  bVar1 = true;
  if ((1 < peer->m_conn_type - FEELER) &&
     (((this->m_opts).ignore_incoming_txs != true || ((peer->m_permission_flags & Relay) != None))))
  {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::RejectIncomingTxs(const CNode& peer) const
{
    // block-relay-only peers may never send txs to us
    if (peer.IsBlockOnlyConn()) return true;
    if (peer.IsFeelerConn()) return true;
    // In -blocksonly mode, peers need the 'relay' permission to send txs to us
    if (m_opts.ignore_incoming_txs && !peer.HasPermission(NetPermissionFlags::Relay)) return true;
    return false;
}